

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

void basic_cpio(char *target,char *pack_options,char *unpack_options,char *se,char *se2)

{
  wchar_t wVar1;
  
  wVar1 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
                             ,L'4',target,L'ǽ');
  if (wVar1 != L'\0') {
    wVar1 = systemf("%s -R 1000:1000 -o %s < filelist >%s/archive 2>%s/pack.err",testprog,
                    pack_options,target);
    failure("Error invoking %s -o %s",testprog,pack_options);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
                        ,L';',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
                    ,L'=',target);
    failure("Expected: %s, options=%s",unpack_options,pack_options);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
               ,L'A',unpack_options,"pack.err");
    wVar1 = systemf("%s -i %s< archive >unpack.out 2>unpack.err",testprog,"");
    failure("Error invoking %s -i %s",testprog,"");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
                        ,L'I',(long)wVar1,"r",0,"0",(void *)0x0);
    failure("Error invoking %s -i %s in dir %s",testprog,"",target);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
               ,L'M',se,"unpack.err");
    verify_files(pack_options);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_basic.c"
                    ,L'Q',"..");
    return;
  }
  return;
}

Assistant:

static void
basic_cpio(const char *target,
    const char *pack_options,
    const char *unpack_options,
    const char *se, const char *se2)
{
	int r;

	if (!assertMakeDir(target, 0775))
	    return;

	/* Use the cpio program to create an archive. */
	r = systemf("%s -R 1000:1000 -o %s < filelist >%s/archive 2>%s/pack.err",
	    testprog, pack_options, target, target);
	failure("Error invoking %s -o %s", testprog, pack_options);
	assertEqualInt(r, 0);

	assertChdir(target);

	/* Verify stderr. */
	failure("Expected: %s, options=%s", se, pack_options);
	assertTextFileContents(se, "pack.err");

	/*
	 * Use cpio to unpack the archive into another directory.
	 */
	r = systemf("%s -i %s< archive >unpack.out 2>unpack.err",
	    testprog, unpack_options);
	failure("Error invoking %s -i %s", testprog, unpack_options);
	assertEqualInt(r, 0);

	/* Verify stderr. */
	failure("Error invoking %s -i %s in dir %s", testprog, unpack_options, target);
	assertTextFileContents(se2, "unpack.err");

	verify_files(pack_options);

	assertChdir("..");
}